

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

void __thiscall CPlayer::OnDirectInput(CPlayer *this,CNetObj_PlayerInput *NewInput)

{
  int iVar1;
  CGameContext *pCVar2;
  CCharacter *this_00;
  CFlag *this_01;
  CPlayer *pCVar3;
  IServer *this_02;
  int iVar4;
  int *in_RSI;
  CPlayer *in_RDI;
  long in_FS_OFFSET;
  float fVar5;
  float fVar6;
  CFlag *pFlag;
  CCharacter *pChar;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffe8;
  vec2 this_03;
  vec2 Pos;
  
  Pos = *(vec2 *)(in_FS_OFFSET + 0x28);
  pCVar3 = in_RDI;
  pCVar2 = GameServer(in_RDI);
  if (((pCVar2->m_World).m_Paused & 1U) != 0) {
    in_RDI->m_PlayerFlags = in_RSI[6];
    goto LAB_00130f04;
  }
  if ((in_RSI[6] & 2U) != 0) {
    if ((in_RDI->m_PlayerFlags & 2U) == 0) {
      if (in_RDI->m_pCharacter != (CCharacter *)0x0) {
        CCharacter::ResetInput((CCharacter *)in_RDI);
      }
      in_RDI->m_PlayerFlags = in_RSI[6];
    }
    goto LAB_00130f04;
  }
  in_RDI->m_PlayerFlags = in_RSI[6];
  if (in_RDI->m_pCharacter != (CCharacter *)0x0) {
    CCharacter::OnDirectInput
              ((CCharacter *)in_RDI,
               (CNetObj_PlayerInput *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
    ;
  }
  if (((in_RDI->m_pCharacter == (CCharacter *)0x0) && (in_RDI->m_Team != -1)) &&
     ((in_RSI[4] & 1U) != 0)) {
    Respawn(in_RDI);
  }
  if (((in_RDI->m_pCharacter == (CCharacter *)0x0) && (in_RDI->m_Team == -1)) &&
     ((in_RSI[4] & 1U) != 0)) {
    if ((in_RDI->m_ActiveSpecSwitch & 1U) == 0) {
      in_RDI->m_ActiveSpecSwitch = true;
      if (in_RDI->m_SpecMode == 0) {
        GameServer(in_RDI);
        this_03 = in_RDI->m_ViewPos;
        this_00 = (CCharacter *)
                  CGameWorld::ClosestEntity
                            ((CGameWorld *)this_03,Pos,
                             (float)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                             (int)in_stack_ffffffffffffffe8,(CEntity *)pCVar3);
        GameServer(in_RDI);
        this_01 = (CFlag *)CGameWorld::ClosestEntity
                                     ((CGameWorld *)this_03,Pos,(in_RDI->m_ViewPos).field_1.y,
                                      (int)(in_RDI->m_ViewPos).field_0,(CEntity *)pCVar3);
        if ((this_00 != (CCharacter *)0x0) || (this_01 != (CFlag *)0x0)) {
          if (this_00 == (CCharacter *)0x0) {
LAB_00130da5:
            iVar1 = CFlag::GetTeam(this_01);
            iVar4 = 3;
            if (iVar1 == 0) {
              iVar4 = 2;
            }
            in_RDI->m_SpecMode = iVar4;
            in_RDI->m_pSpecFlag = this_01;
            in_RDI->m_SpectatorID = -1;
          }
          else {
            if ((this_01 != (CFlag *)0x0) && (this_00 != (CCharacter *)0x0)) {
              CEntity::GetPos((CEntity *)this_01);
              fVar5 = distance<float>(&in_RDI->m_ViewPos,
                                      (vector2_base<float> *)
                                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
              ;
              CEntity::GetPos((CEntity *)this_00);
              fVar6 = distance<float>(&in_RDI->m_ViewPos,
                                      (vector2_base<float> *)
                                      CONCAT44(fVar5,in_stack_ffffffffffffffb8));
              if (fVar5 < fVar6) goto LAB_00130da5;
            }
            in_RDI->m_SpecMode = 1;
            in_RDI->m_pSpecFlag = (CFlag *)0x0;
            pCVar3 = CCharacter::GetPlayer(this_00);
            iVar1 = GetCID(pCVar3);
            in_RDI->m_SpectatorID = iVar1;
          }
        }
      }
      else {
        in_RDI->m_SpecMode = 0;
        in_RDI->m_pSpecFlag = (CFlag *)0x0;
        in_RDI->m_SpectatorID = -1;
      }
    }
  }
  else if ((in_RDI->m_ActiveSpecSwitch & 1U) != 0) {
    in_RDI->m_ActiveSpecSwitch = false;
  }
  if (((((*in_RSI != 0) || ((in_RDI->m_LatestActivity).m_TargetX != in_RSI[1])) ||
       ((in_RDI->m_LatestActivity).m_TargetY != in_RSI[2])) ||
      ((in_RSI[3] != 0 || ((in_RSI[4] & 1U) != 0)))) || (in_RSI[5] != 0)) {
    (in_RDI->m_LatestActivity).m_TargetX = in_RSI[1];
    (in_RDI->m_LatestActivity).m_TargetY = in_RSI[2];
    this_02 = Server((CPlayer *)0x130ee5);
    iVar1 = IServer::Tick(this_02);
    in_RDI->m_LastActionTick = iVar1;
    in_RDI->m_InactivityTickCounter = 0;
  }
LAB_00130f04:
  if (*(vec2 *)(in_FS_OFFSET + 0x28) != Pos) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CPlayer::OnDirectInput(CNetObj_PlayerInput *NewInput)
{
	if(GameServer()->m_World.m_Paused)
	{
		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	if(NewInput->m_PlayerFlags&PLAYERFLAG_CHATTING)
	{
		// skip the input if chat is active
		if(m_PlayerFlags&PLAYERFLAG_CHATTING)
			return;

		// reset input
		if(m_pCharacter)
			m_pCharacter->ResetInput();

		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	m_PlayerFlags = NewInput->m_PlayerFlags;

	if(m_pCharacter)
		m_pCharacter->OnDirectInput(NewInput);

	if(!m_pCharacter && m_Team != TEAM_SPECTATORS && (NewInput->m_Fire&1))
		Respawn();

	if(!m_pCharacter && m_Team == TEAM_SPECTATORS && (NewInput->m_Fire&1))
	{
		if(!m_ActiveSpecSwitch)
		{
			m_ActiveSpecSwitch = true;
			if(m_SpecMode == SPEC_FREEVIEW)
			{
				CCharacter *pChar = (CCharacter *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_CHARACTER, 0);
				CFlag *pFlag = (CFlag *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_FLAG, 0);
				if(pChar || pFlag)
				{
					if(!pChar || (pFlag && pChar && distance(m_ViewPos, pFlag->GetPos()) < distance(m_ViewPos, pChar->GetPos())))
					{
						m_SpecMode = pFlag->GetTeam() == TEAM_RED ? SPEC_FLAGRED : SPEC_FLAGBLUE;
						m_pSpecFlag = pFlag;
						m_SpectatorID = -1;
					}
					else
					{
						m_SpecMode = SPEC_PLAYER;
						m_pSpecFlag = 0;
						m_SpectatorID = pChar->GetPlayer()->GetCID();
					}
				}
			}
			else
			{
				m_SpecMode = SPEC_FREEVIEW;
				m_pSpecFlag = 0;
				m_SpectatorID = -1;
			}
		}
	}
	else if(m_ActiveSpecSwitch)
		m_ActiveSpecSwitch = false;

	// check for activity
	if(NewInput->m_Direction || m_LatestActivity.m_TargetX != NewInput->m_TargetX ||
		m_LatestActivity.m_TargetY != NewInput->m_TargetY || NewInput->m_Jump ||
		NewInput->m_Fire&1 || NewInput->m_Hook)
	{
		m_LatestActivity.m_TargetX = NewInput->m_TargetX;
		m_LatestActivity.m_TargetY = NewInput->m_TargetY;
		m_LastActionTick = Server()->Tick();
		m_InactivityTickCounter = 0;
	}
}